

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharAtIndex
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,int64_t index)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t size;
  size_t i;
  size_t charCount;
  char *srcEnd;
  char *srcCurr;
  char *destCurr;
  String out;
  char *destTarget;
  char *destEnd;
  char *destStart;
  int64_t index_local;
  String *source_local;
  String *dest_local;
  
  srcCurr = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                      (dest);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    (dest);
  pcVar2 = srcCurr + sVar1;
  out.field_2._8_8_ = GetUtf8CstrByIndex(dest,index);
  if ((char *)out.field_2._8_8_ == (char *)0x0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&destCurr);
    while (srcCurr < pcVar2) {
      if (srcCurr == (char *)out.field_2._8_8_) {
        srcEnd = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(source);
        sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                size(source);
        pcVar3 = srcEnd + sVar1;
        while (srcEnd < pcVar3) {
          sVar4 = GetUtf8CharSize(srcEnd);
          for (size = 0; size < sVar4; size = size + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       &destCurr,*srcEnd);
            srcEnd = srcEnd + 1;
          }
        }
        sVar4 = GetUtf8CharSize(srcCurr);
        srcCurr = srcCurr + sVar4;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&destCurr,
                   *srcCurr);
        srcCurr = srcCurr + 1;
      }
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&destCurr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&destCurr);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharAtIndex(const String & dest, const String & source, int64_t index)
	{
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * destTarget = GetUtf8CstrByIndex(dest, index);
		if (destTarget == nullptr)
			return std::optional<String>();
		String out;
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == destTarget)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t size = GetUtf8CharSize(destCurr);
				destCurr += size;
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}